

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O3

long __thiscall MemoryReader::Seek(MemoryReader *this,long offset,int origin)

{
  long lVar1;
  
  if (origin == 2) {
    offset = offset + (this->super_FileReader).Length;
  }
  else if (origin == 1) {
    offset = offset + (this->super_FileReader).FilePos;
  }
  lVar1 = (this->super_FileReader).Length;
  if (offset < lVar1) {
    lVar1 = offset;
  }
  if (offset < 1) {
    lVar1 = 0;
  }
  (this->super_FileReader).FilePos = lVar1;
  return 0;
}

Assistant:

long MemoryReader::Seek (long offset, int origin)
{
	switch (origin)
	{
	case SEEK_CUR:
		offset+=FilePos;
		break;

	case SEEK_END:
		offset+=Length;
		break;

	}
	FilePos=clamp<long>(offset,0,Length);
	return 0;
}